

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

_Bool rsa1_save_f(Filename *filename,RSAKey *key,char *passphrase)

{
  size_t sVar1;
  int iVar2;
  FILE *__s;
  strbuf *buf_o;
  size_t sVar3;
  bool local_39;
  _Bool toret;
  strbuf *buf;
  FILE *fp;
  char *passphrase_local;
  RSAKey *key_local;
  Filename *filename_local;
  
  __s = (FILE *)f_open(filename,"wb",true);
  if (__s == (FILE *)0x0) {
    filename_local._7_1_ = false;
  }
  else {
    buf_o = rsa1_save_sb(key,passphrase);
    sVar3 = fwrite(buf_o->s,1,buf_o->len,__s);
    sVar1 = buf_o->len;
    iVar2 = fclose(__s);
    local_39 = iVar2 == 0 && sVar3 == sVar1;
    strbuf_free(buf_o);
    filename_local._7_1_ = local_39;
  }
  return filename_local._7_1_;
}

Assistant:

bool rsa1_save_f(const Filename *filename, RSAKey *key, const char *passphrase)
{
    FILE *fp = f_open(filename, "wb", true);
    if (!fp)
        return false;

    strbuf *buf = rsa1_save_sb(key, passphrase);
    bool toret = fwrite(buf->s, 1, buf->len, fp) == buf->len;
    if (fclose(fp))
        toret = false;
    strbuf_free(buf);
    return toret;
}